

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

UBool icu_63::UnicodeSet::resemblesPropertyPattern(RuleCharacterIterator *chars,int32_t iterOpts)

{
  bool bVar1;
  UChar32 UVar2;
  UChar32 UVar3;
  UBool literal;
  UErrorCode ec;
  Pos pos;
  UBool local_35;
  UErrorCode local_34;
  Pos local_30;
  
  local_34 = U_ZERO_ERROR;
  RuleCharacterIterator::getPos(chars,&local_30);
  UVar2 = RuleCharacterIterator::next(chars,iterOpts & 0xfffffffd,&local_35,&local_34);
  if (UVar2 - 0x5bU < 2) {
    UVar3 = RuleCharacterIterator::next(chars,iterOpts & 0xfffffff9,&local_35,&local_34);
    if (UVar2 == 0x5b) {
      RuleCharacterIterator::setPos(chars,&local_30);
      if (UVar3 != 0x3a) goto LAB_002d7345;
    }
    else {
      if ((0x22 < UVar3 - 0x4eU) || ((0x400000005U >> ((ulong)(UVar3 - 0x4eU) & 0x3f) & 1) == 0))
      goto LAB_002d7338;
      RuleCharacterIterator::setPos(chars,&local_30);
    }
    bVar1 = local_34 < U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
LAB_002d7338:
    RuleCharacterIterator::setPos(chars,&local_30);
LAB_002d7345:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

UBool UnicodeSet::resemblesPropertyPattern(RuleCharacterIterator& chars,
                                           int32_t iterOpts) {
    // NOTE: literal will always be FALSE, because we don't parse escapes.
    UBool result = FALSE, literal;
    UErrorCode ec = U_ZERO_ERROR;
    iterOpts &= ~RuleCharacterIterator::PARSE_ESCAPES;
    RuleCharacterIterator::Pos pos;
    chars.getPos(pos);
    UChar32 c = chars.next(iterOpts, literal, ec);
    if (c == 0x5B /*'['*/ || c == 0x5C /*'\\'*/) {
        UChar32 d = chars.next(iterOpts & ~RuleCharacterIterator::SKIP_WHITESPACE,
                               literal, ec);
        result = (c == 0x5B /*'['*/) ? (d == 0x3A /*':'*/) :
                 (d == 0x4E /*'N'*/ || d == 0x70 /*'p'*/ || d == 0x50 /*'P'*/);
    }
    chars.setPos(pos);
    return result && U_SUCCESS(ec);
}